

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

void __thiscall ED::ComputeGradient(ED *this)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  short *psVar9;
  int iVar10;
  long lVar11;
  int unaff_R12D;
  int iVar12;
  int unaff_R14D;
  int iVar13;
  double dVar14;
  int local_34;
  
  lVar4 = (long)this->width;
  if (0 < lVar4) {
    sVar5 = (short)this->gradThresh + -1;
    psVar9 = this->gradImg;
    iVar8 = this->height;
    lVar11 = 0;
    do {
      psVar9[((long)iVar8 + -1) * lVar4 + lVar11] = sVar5;
      psVar9[lVar11] = sVar5;
      lVar11 = lVar11 + 1;
    } while (lVar4 != lVar11);
  }
  if (2 < this->height) {
    sVar5 = (short)this->gradThresh + -1;
    psVar9 = this->gradImg;
    lVar11 = (ulong)(this->height - 1) - 1;
    do {
      psVar9[lVar4 * 2 + -1] = sVar5;
      psVar9[lVar4] = sVar5;
      psVar9 = psVar9 + lVar4;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if (2 < this->height) {
    iVar8 = 1;
    local_34 = 2;
    iVar13 = 0;
    do {
      iVar3 = this->width;
      if (2 < iVar3) {
        lVar4 = 1;
        do {
          if (this->op - PREWITT_OPERATOR < 4) {
            puVar1 = this->smoothImg;
            iVar2 = local_34 * iVar3;
            iVar6 = iVar13 * iVar3;
            iVar7 = (uint)puVar1[lVar4 + 1 + (long)iVar2] - (uint)puVar1[lVar4 + -1 + (long)iVar6];
            iVar10 = (uint)puVar1[lVar4 + 1 + (long)iVar6] - (uint)puVar1[lVar4 + -1 + (long)iVar2];
            iVar12 = (int)lVar4;
            switch(this->op) {
            case PREWITT_OPERATOR:
              lVar11 = (long)(iVar3 * iVar8 + iVar12);
              iVar3 = ((uint)puVar1[lVar11 + 1] + iVar10 + iVar7) - (uint)puVar1[lVar11 + -1];
              unaff_R12D = -iVar3;
              if (0 < iVar3) {
                unaff_R12D = iVar3;
              }
              iVar3 = ((uint)puVar1[lVar4 + iVar2] + iVar7) - ((uint)puVar1[lVar4 + iVar6] + iVar10)
              ;
              break;
            case SOBEL_OPERATOR:
              lVar11 = (long)(iVar3 * iVar8 + iVar12);
              iVar3 = iVar10 + iVar7 + ((uint)puVar1[lVar11 + 1] - (uint)puVar1[lVar11 + -1]) * 2;
              unaff_R12D = -iVar3;
              if (0 < iVar3) {
                unaff_R12D = iVar3;
              }
              iVar3 = (iVar7 - iVar10) +
                      ((uint)puVar1[lVar4 + iVar2] - (uint)puVar1[lVar4 + iVar6]) * 2;
              break;
            case SCHARR_OPERATOR:
              lVar11 = (long)(iVar3 * iVar8 + iVar12);
              iVar3 = (iVar10 + iVar7) * 3 +
                      ((uint)puVar1[lVar11 + 1] - (uint)puVar1[lVar11 + -1]) * 10;
              unaff_R12D = -iVar3;
              if (0 < iVar3) {
                unaff_R12D = iVar3;
              }
              iVar3 = (iVar7 - iVar10) * 3 +
                      ((uint)puVar1[lVar4 + iVar2] - (uint)puVar1[lVar4 + iVar6]) * 10;
              break;
            case LSD_OPERATOR:
              lVar11 = (long)(iVar3 * iVar8 + iVar12);
              iVar6 = (uint)puVar1[lVar4 + 1 + (long)iVar2] - (uint)puVar1[lVar11];
              iVar3 = ((uint)puVar1[lVar11 + 1] - (uint)puVar1[lVar4 + iVar2]) + iVar6;
              unaff_R12D = -iVar3;
              if (0 < iVar3) {
                unaff_R12D = iVar3;
              }
              iVar6 = iVar6 - ((uint)puVar1[lVar11 + 1] - (uint)puVar1[lVar4 + iVar2]);
              unaff_R14D = -iVar6;
              if (0 < iVar6) {
                unaff_R14D = iVar6;
              }
              goto LAB_00105d91;
            }
            unaff_R14D = -iVar3;
            if (0 < iVar3) {
              unaff_R14D = iVar3;
            }
          }
LAB_00105d91:
          if (this->sumFlag == true) {
            iVar3 = unaff_R14D + unaff_R12D;
          }
          else {
            dVar14 = (double)unaff_R12D * (double)unaff_R12D + (double)(unaff_R14D * unaff_R14D);
            if (dVar14 < 0.0) {
              dVar14 = sqrt(dVar14);
            }
            else {
              dVar14 = SQRT(dVar14);
            }
            iVar3 = (int)dVar14;
          }
          lVar11 = (long)(this->width * iVar8);
          this->gradImg[lVar11 + lVar4] = (short)iVar3;
          if (this->gradThresh <= iVar3) {
            this->dirImg[lVar4 + lVar11] = (unaff_R12D < unaff_R14D) + '\x01';
          }
          iVar3 = this->width;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < iVar3 + -1);
      }
      iVar8 = iVar8 + 1;
      local_34 = local_34 + 1;
      iVar13 = iVar13 + 1;
    } while (iVar8 < this->height + -1);
  }
  return;
}

Assistant:

void ED::ComputeGradient()
{	
	// Initialize gradient image for row = 0, row = height-1, column=0, column=width-1 
	for (int j = 0; j<width; j++) { gradImg[j] = gradImg[(height - 1)*width + j] = gradThresh - 1; }
	for (int i = 1; i<height - 1; i++) { gradImg[i*width] = gradImg[(i + 1)*width - 1] = gradThresh - 1; }

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// 
			// For Prewitt
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			// For Sobel
			// Then: gx = com1 + com2 + 2*(E-D) = (H-A) + (C-F) + 2*(E-D) = (C-A) + 2*(E-D) + (H-F)
			//       gy = com1 - com2 + 2*(G-B) = (H-A) - (C-F) + 2*(G-B) = (F-A) + 2*(G-B) + (H-C)
			//
			// For Scharr
			// Then: gx = 3*(com1 + com2) + 10*(E-D) = 3*(H-A) + 3*(C-F) + 10*(E-D) = 3*(C-A) + 10*(E-D) + 3*(H-F)
			//       gy = 3*(com1 - com2) + 10*(G-B) = 3*(H-A) - 3*(C-F) + 10*(G-B) = 3*(F-A) + 10*(G-B) + 3*(H-C)
			//
			// For LSD
			// A B
			// C D
			// gx = (B-A) + (D-C)
			// gy = (C-A) + (D-B)
			//
			// To make this faster: 
			// com1 = (D-A)
			// com2 = (B-C)
			// Then: gx = com1 + com2 = (D-A) + (B-C) = (B-A) + (D-C)
			//       gy = com1 - com2 = (D-A) - (B-C) = (C-A) + (D-B)

			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx;
			int gy;
			
			switch (op)
			{
			case PREWITT_OPERATOR:
				gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SOBEL_OPERATOR:
				gx = abs(com1 + com2 + 2 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + 2 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SCHARR_OPERATOR:
				gx = abs(3 * (com1 + com2) + 10 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(3 * (com1 - com2) + 10 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case LSD_OPERATOR:
				// com1 and com2 differs from previous operators, because LSD has 2x2 kernel
				int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[i*width + j];
				int com2 = smoothImg[i*width + j + 1] - smoothImg[(i + 1)*width + j];

				gx = abs(com1 + com2);
				gy = abs(com1 - com2);
			}
			
			int sum;

			if(sumFlag)
				sum = gx + gy;
			else
				sum = (int)sqrt((double)gx*gx + gy*gy);

			int index = i*width + j;
			gradImg[index] = sum;

			if (sum >= gradThresh) {
				if (gx >= gy) dirImg[index] = EDGE_VERTICAL;
				else          dirImg[index] = EDGE_HORIZONTAL;
			} //end-if
		} // end-for
	} // end-for
}